

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_tracker_connection.cpp
# Opt level: O0

void __thiscall libtorrent::aux::http_tracker_connection::start(http_tracker_connection *this)

{
  unsigned_long *this_00;
  ushort uVar1;
  uint32_t uVar2;
  int64_t iVar3;
  int64_t iVar4;
  int64_t iVar5;
  int64_t iVar6;
  io_context *__args_1;
  bool bVar7;
  int iVar8;
  tracker_request *ptVar9;
  char *pcVar10;
  char *pcVar11;
  value_type *ppcVar12;
  pointer pvVar13;
  ulong uVar14;
  _Bind<void_(libtorrent::aux::http_tracker_connection::*(std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>))(const_boost::system::error_code_&,_const_libtorrent::aux::http_parser_&,_libtorrent::span<const_char>)>
  *__args_2;
  string *psVar15;
  listen_socket_handle *o;
  element_type *this_01;
  element_type *peVar16;
  undefined8 uVar17;
  char *in_RCX;
  basic_string_view<char,_std::char_traits<char>_> query_string;
  undefined1 auVar18 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  aVar19;
  string_view str_00;
  string_view str_01;
  string_view str_02;
  string_view str_03;
  string_view str_04;
  string_view str_05;
  undefined8 in_stack_fffffffffffff3b0;
  undefined4 uVar20;
  proxy_settings *local_c00;
  byte local_bc6;
  int local_bc0;
  char *local_af0;
  bool local_a1a;
  undefined1 local_9f8 [8];
  shared_ptr<libtorrent::aux::request_callback> cb;
  string local_9e0;
  undefined1 local_9bb;
  bitfield_flag<unsigned_char,_libtorrent::aux::resolver_flag_tag,_void> local_9ba;
  resolver_flags local_9b9;
  optional<libtorrent::aux::bind_info_t> local_9b8;
  duration<long,_std::ratio<1L,_1L>_> local_970;
  time_duration local_968;
  undefined1 local_960 [8];
  proxy_settings ps;
  undefined1 local_8f0 [8];
  bind_info_t bi;
  listen_socket_handle ls;
  undefined1 local_898 [8];
  string user_agent;
  undefined1 local_870 [3];
  bool anon_user;
  int timeout;
  code *local_860;
  context *local_858;
  type local_850;
  undefined1 local_830 [64];
  undefined1 local_7f0 [32];
  _Bind<void_(libtorrent::aux::http_tracker_connection::*(std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::_Placeholder<1>,_std::_Placeholder<2>))(libtorrent::aux::http_connection_&,_std::vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>_&)>
  local_7d0;
  undefined1 local_7b0 [8];
  undefined1 local_7a8 [32];
  type local_788;
  io_context local_768;
  undefined1 local_758 [8];
  int local_750;
  duration<int,std::ratio<1l,1l>> local_74c [4];
  error_code local_748;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_738;
  string local_728;
  undefined1 local_708 [8];
  string ip_1;
  address_v6 *v6;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  vector<boost::asio::ip::address_v6,_std::allocator<boost::asio::ip::address_v6>_> *__range3_1;
  string local_6b8;
  undefined1 local_698 [8];
  string ip;
  address_v4 *v4;
  const_iterator __end3;
  const_iterator __begin3;
  vector<boost::asio::ip::address_v4,_std::allocator<boost::asio::ip::address_v4>_> *__range3;
  string local_648;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_628;
  undefined8 local_608;
  string *announce_ip;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e0;
  int local_5c0;
  duration<int,std::ratio<1l,1l>> local_5bc [4];
  int local_5b8;
  seconds32 local_5b4;
  error_code local_5b0;
  undefined1 local_5a0 [16];
  string local_590;
  array<char,_22UL> local_56e;
  basic_string_view<char,_std::char_traits<char>_> local_558;
  string local_548;
  char local_528 [8];
  char str [1024];
  bitfield_flag local_119;
  basic_string_view<char,_std::char_traits<char>_> local_118;
  string local_108;
  int local_e8;
  seconds32 local_e4;
  int local_e0;
  seconds32 local_dc;
  error_code local_d8;
  basic_string_view<char,_std::char_traits<char>_> local_c8;
  char *local_b8;
  char *local_b0;
  undefined1 local_a1;
  long lStack_a0;
  bool ssrf_mitigation;
  size_type arguments_start;
  session_settings *settings;
  int iStack_88;
  bool i2p;
  seconds32 local_84;
  int local_80;
  seconds32 local_7c;
  error_code local_78;
  ulong local_68;
  size_t pos;
  uchar local_4a;
  bitfield_flag local_49;
  undefined1 local_48 [8];
  string url;
  http_tracker_connection *this_local;
  
  uVar20 = (undefined4)((ulong)in_stack_fffffffffffff3b0 >> 0x20);
  url.field_2._8_8_ = this;
  ptVar9 = tracker_connection::tracker_req(&this->super_tracker_connection);
  ::std::__cxx11::string::string((string *)local_48,(string *)ptVar9);
  ptVar9 = tracker_connection::tracker_req(&this->super_tracker_connection);
  local_4a = (ptVar9->kind).m_val;
  pos._3_1_ = 1;
  local_49 = (bitfield_flag)
             libtorrent::flags::operator&
                       ((bitfield_flag<unsigned_char,_libtorrent::aux::tracker_request_flags_tag,_void>
                         )local_4a,
                        (bitfield_flag<unsigned_char,_libtorrent::aux::tracker_request_flags_tag,_void>
                         )0x1);
  bVar7 = libtorrent::flags::bitfield_flag::operator_cast_to_bool(&local_49);
  if (bVar7) {
    local_68 = ::std::__cxx11::string::find(local_48,0x876cc8);
    if (local_68 == 0xffffffffffffffff) {
      boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                (&local_78,scrape_not_available,(type *)0x0);
      local_80 = 0;
      ::std::chrono::duration<int,std::ratio<1l,1l>>::duration<int,void>
                ((duration<int,std::ratio<1l,1l>> *)&local_7c,&local_80);
      iStack_88 = 0;
      ::std::chrono::duration<int,std::ratio<1l,1l>>::duration<int,void>
                ((duration<int,std::ratio<1l,1l>> *)&local_84,&stack0xffffffffffffff78);
      tracker_connection::fail
                (&this->super_tracker_connection,&local_78,bittorrent,"",local_7c,local_84);
      settings._4_4_ = 1;
      goto LAB_003b73d4;
    }
    in_RCX = "scrape";
    ::std::__cxx11::string::replace((ulong)local_48,local_68,(char *)0x8);
  }
  settings._3_1_ = is_i2p_url((string *)local_48);
  pcVar11 = (char *)CONCAT71((int7)((ulong)in_RCX >> 8),settings._3_1_);
  arguments_start = (size_type)tracker_manager::settings((this->super_tracker_connection).m_man);
  lStack_a0 = ::std::__cxx11::string::find((char)local_48,0x3f);
  if (lStack_a0 == -1) {
    ::std::__cxx11::string::operator+=((string *)local_48,"?");
  }
  else {
    local_a1 = session_settings::get_bool((session_settings *)arguments_start,0x8050);
    local_a1a = false;
    if ((bool)local_a1) {
      local_c8 = (basic_string_view<char,_std::char_traits<char>_>)
                 ::std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_48);
      query_string = ::std::basic_string_view<char,_std::char_traits<char>_>::substr
                               (&local_c8,lStack_a0 + 1,0xffffffffffffffff);
      local_b0 = query_string._M_str;
      pcVar11 = (char *)query_string._M_len;
      local_b8 = pcVar11;
      local_a1a = has_tracker_query_string(query_string);
    }
    if (local_a1a != false) {
      boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                (&local_d8,ssrf_mitigation,(type *)0x0);
      local_e0 = 0;
      ::std::chrono::duration<int,std::ratio<1l,1l>>::duration<int,void>
                ((duration<int,std::ratio<1l,1l>> *)&local_dc,&local_e0);
      local_e8 = 0;
      ::std::chrono::duration<int,std::ratio<1l,1l>>::duration<int,void>
                ((duration<int,std::ratio<1l,1l>> *)&local_e4,&local_e8);
      tracker_connection::fail
                (&this->super_tracker_connection,&local_d8,bittorrent,"",local_dc,local_e4);
      settings._4_4_ = 1;
      goto LAB_003b73d4;
    }
    ::std::__cxx11::string::operator+=((string *)local_48,"&");
  }
  ::std::__cxx11::string::operator+=((string *)local_48,"info_hash=");
  ptVar9 = tracker_connection::tracker_req(&this->super_tracker_connection);
  pcVar10 = digest32<160L>::data(&ptVar9->info_hash);
  ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_118,pcVar10,0x14);
  str_00._M_str = pcVar11;
  str_00._M_len = (size_t)local_118._M_str;
  escape_string_abi_cxx11_(&local_108,(libtorrent *)local_118._M_len,str_00);
  ::std::__cxx11::string::operator+=((string *)local_48,(string *)&local_108);
  ::std::__cxx11::string::~string((string *)&local_108);
  ptVar9 = tracker_connection::tracker_req(&this->super_tracker_connection);
  local_119 = (bitfield_flag)
              libtorrent::flags::operator&
                        ((bitfield_flag<unsigned_char,_libtorrent::aux::tracker_request_flags_tag,_void>
                          )(ptVar9->kind).m_val,
                         (bitfield_flag<unsigned_char,_libtorrent::aux::tracker_request_flags_tag,_void>
                          )0x1);
  bVar7 = libtorrent::flags::bitfield_flag::operator_cast_to_bool(&local_119);
  if (((bVar7 ^ 0xffU) & 1) != 0) {
    ptVar9 = tracker_connection::tracker_req(&this->super_tracker_connection);
    pcVar10 = digest32<160L>::data(&ptVar9->pid);
    ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_558,pcVar10,0x14);
    str_01._M_str = pcVar11;
    str_01._M_len = (size_t)local_558._M_str;
    escape_string_abi_cxx11_(&local_548,(libtorrent *)local_558._M_len,str_01);
    pcVar11 = (char *)::std::__cxx11::string::c_str();
    ptVar9 = tracker_connection::tracker_req(&this->super_tracker_connection);
    uVar1 = ptVar9->listen_port;
    ptVar9 = tracker_connection::tracker_req(&this->super_tracker_connection);
    iVar3 = ptVar9->uploaded;
    ptVar9 = tracker_connection::tracker_req(&this->super_tracker_connection);
    iVar4 = ptVar9->downloaded;
    ptVar9 = tracker_connection::tracker_req(&this->super_tracker_connection);
    iVar5 = ptVar9->left;
    ptVar9 = tracker_connection::tracker_req(&this->super_tracker_connection);
    iVar6 = ptVar9->corrupt;
    ptVar9 = tracker_connection::tracker_req(&this->super_tracker_connection);
    uVar2 = ptVar9->key;
    ptVar9 = tracker_connection::tracker_req(&this->super_tracker_connection);
    pcVar10 = "";
    if (ptVar9->event != none) {
      pcVar10 = "&event=";
    }
    ptVar9 = tracker_connection::tracker_req(&this->super_tracker_connection);
    if (ptVar9->event == none) {
      local_af0 = "";
    }
    else {
      ptVar9 = tracker_connection::tracker_req(&this->super_tracker_connection);
      ppcVar12 = container_wrapper<const_char_*,_long,_std::array<const_char_*,_4UL>_>::operator[]
                           (&start::event_string,(ulong)ptVar9->event - 1);
      local_af0 = *ppcVar12;
    }
    ptVar9 = tracker_connection::tracker_req(&this->super_tracker_connection);
    snprintf(local_528,0x400,
             "&peer_id=%s&port=%d&uploaded=%ld&downloaded=%ld&left=%ld&corrupt=%ld&key=%08X%s%s&numwant=%d&compact=1&no_peer_id=1"
             ,pcVar11,(ulong)uVar1,iVar3,iVar4,iVar5,iVar6,CONCAT44(uVar20,uVar2),pcVar10,local_af0,
             ptVar9->num_want);
    ::std::__cxx11::string::~string((string *)&local_548);
    ::std::__cxx11::string::operator+=((string *)local_48,local_528);
    iVar8 = session_settings::get_int((session_settings *)arguments_start,0x4077);
    if (iVar8 != 2) {
      bVar7 = session_settings::get_bool((session_settings *)arguments_start,0x803a);
      if (bVar7) {
        ::std::__cxx11::string::operator+=((string *)local_48,"&supportcrypto=1");
      }
    }
    bVar7 = session_settings::get_bool((session_settings *)arguments_start,0x8037);
    if (bVar7) {
      ::std::__cxx11::string::operator+=((string *)local_48,"&redundant=");
      ptVar9 = tracker_connection::tracker_req(&this->super_tracker_connection);
      to_string(&local_56e,ptVar9->redundant);
      pvVar13 = ::std::array<char,_22UL>::data((array<char,_22UL> *)&local_56e);
      ::std::__cxx11::string::operator+=((string *)local_48,pvVar13);
    }
    tracker_connection::tracker_req(&this->super_tracker_connection);
    uVar14 = ::std::__cxx11::string::empty();
    if ((uVar14 & 1) == 0) {
      ::std::__cxx11::string::operator+=((string *)local_48,"&trackerid=");
      ptVar9 = tracker_connection::tracker_req(&this->super_tracker_connection);
      local_5a0 = ::std::__cxx11::string::operator_cast_to_basic_string_view
                            ((string *)&ptVar9->trackerid);
      str_02._M_len = local_5a0._8_8_;
      str_02._M_str = pcVar11;
      escape_string_abi_cxx11_(&local_590,local_5a0._0_8_,str_02);
      ::std::__cxx11::string::operator+=((string *)local_48,(string *)&local_590);
      ::std::__cxx11::string::~string((string *)&local_590);
    }
    if ((settings._3_1_ & 1) != 0) {
      ptVar9 = tracker_connection::tracker_req(&this->super_tracker_connection);
      if (ptVar9->i2pconn != (i2p_connection *)0x0) {
        ptVar9 = tracker_connection::tracker_req(&this->super_tracker_connection);
        i2p_connection::local_endpoint_abi_cxx11_(ptVar9->i2pconn);
        uVar14 = ::std::__cxx11::string::empty();
        if ((uVar14 & 1) != 0) {
          boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                    (&local_5b0,no_i2p_endpoint,(type *)0x0);
          local_5b8 = 5;
          ::std::chrono::duration<int,std::ratio<1l,1l>>::duration<int,void>
                    ((duration<int,std::ratio<1l,1l>> *)&local_5b4,&local_5b8);
          local_5c0 = 0;
          ::std::chrono::duration<int,std::ratio<1l,1l>>::duration<int,void>(local_5bc,&local_5c0);
          tracker_connection::fail
                    (&this->super_tracker_connection,&local_5b0,bittorrent,
                     "Waiting for i2p acceptor from SAM bridge",local_5b4,(seconds32)local_5bc);
          settings._4_4_ = 1;
          goto LAB_003b73d4;
        }
        ptVar9 = tracker_connection::tracker_req(&this->super_tracker_connection);
        psVar15 = i2p_connection::local_endpoint_abi_cxx11_(ptVar9->i2pconn);
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &announce_ip,"&ip=",psVar15);
        ::std::operator+(&local_5e0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &announce_ip,".i2p");
        ::std::__cxx11::string::operator+=((string *)local_48,(string *)&local_5e0);
        ::std::__cxx11::string::~string((string *)&local_5e0);
        ::std::__cxx11::string::~string((string *)&announce_ip);
        goto LAB_003b673d;
      }
    }
    bVar7 = session_settings::get_bool((session_settings *)arguments_start,0x8026);
    if (!bVar7) {
      local_608 = session_settings::get_str_abi_cxx11_((session_settings *)arguments_start,1);
      uVar14 = ::std::__cxx11::string::empty();
      if ((uVar14 & 1) == 0) {
        auVar18 = ::std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_608);
        str_03._M_len = auVar18._8_8_;
        str_03._M_str = pcVar11;
        escape_string_abi_cxx11_(&local_648,auVar18._0_8_,str_03);
        ::std::operator+(&local_628,"&ip=",&local_648);
        ::std::__cxx11::string::operator+=((string *)local_48,(string *)&local_628);
        ::std::__cxx11::string::~string((string *)&local_628);
        ::std::__cxx11::string::~string((string *)&local_648);
      }
    }
  }
LAB_003b673d:
  ptVar9 = tracker_connection::tracker_req(&this->super_tracker_connection);
  bVar7 = ::std::vector<boost::asio::ip::address_v4,_std::allocator<boost::asio::ip::address_v4>_>::
          empty(&ptVar9->ipv4);
  if ((!bVar7) && ((settings._3_1_ & 1) == 0)) {
    ptVar9 = tracker_connection::tracker_req(&this->super_tracker_connection);
    __end3 = ::std::
             vector<boost::asio::ip::address_v4,_std::allocator<boost::asio::ip::address_v4>_>::
             begin(&ptVar9->ipv4);
    v4 = (address_v4 *)
         ::std::vector<boost::asio::ip::address_v4,_std::allocator<boost::asio::ip::address_v4>_>::
         end(&ptVar9->ipv4);
    while( true ) {
      bVar7 = __gnu_cxx::operator!=
                        (&__end3,(__normal_iterator<const_boost::asio::ip::address_v4_*,_std::vector<boost::asio::ip::address_v4,_std::allocator<boost::asio::ip::address_v4>_>_>
                                  *)&v4);
      if (!bVar7) break;
      ip.field_2._8_8_ =
           __gnu_cxx::
           __normal_iterator<const_boost::asio::ip::address_v4_*,_std::vector<boost::asio::ip::address_v4,_std::allocator<boost::asio::ip::address_v4>_>_>
           ::operator*(&__end3);
      boost::asio::ip::address_v4::to_string_abi_cxx11_
                ((string *)local_698,(address_v4 *)ip.field_2._8_8_);
      ::std::__cxx11::string::operator+=((string *)local_48,"&ipv4=");
      auVar18 = ::std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_698);
      str_04._M_len = auVar18._8_8_;
      str_04._M_str = pcVar11;
      escape_string_abi_cxx11_(&local_6b8,auVar18._0_8_,str_04);
      ::std::__cxx11::string::operator+=((string *)local_48,(string *)&local_6b8);
      ::std::__cxx11::string::~string((string *)&local_6b8);
      ::std::__cxx11::string::~string((string *)local_698);
      __gnu_cxx::
      __normal_iterator<const_boost::asio::ip::address_v4_*,_std::vector<boost::asio::ip::address_v4,_std::allocator<boost::asio::ip::address_v4>_>_>
      ::operator++(&__end3);
    }
  }
  ptVar9 = tracker_connection::tracker_req(&this->super_tracker_connection);
  bVar7 = ::std::vector<boost::asio::ip::address_v6,_std::allocator<boost::asio::ip::address_v6>_>::
          empty(&ptVar9->ipv6);
  aVar19._8_8_ = local_738._8_8_;
  aVar19._M_allocated_capacity = local_738._M_allocated_capacity;
  if ((!bVar7) && (local_738 = aVar19, (settings._3_1_ & 1) == 0)) {
    ptVar9 = tracker_connection::tracker_req(&this->super_tracker_connection);
    __end3_1 = ::std::
               vector<boost::asio::ip::address_v6,_std::allocator<boost::asio::ip::address_v6>_>::
               begin(&ptVar9->ipv6);
    v6 = (address_v6 *)
         ::std::vector<boost::asio::ip::address_v6,_std::allocator<boost::asio::ip::address_v6>_>::
         end(&ptVar9->ipv6);
    while( true ) {
      bVar7 = __gnu_cxx::operator!=
                        (&__end3_1,
                         (__normal_iterator<const_boost::asio::ip::address_v6_*,_std::vector<boost::asio::ip::address_v6,_std::allocator<boost::asio::ip::address_v6>_>_>
                          *)&v6);
      if (!bVar7) break;
      ip_1.field_2._8_8_ =
           __gnu_cxx::
           __normal_iterator<const_boost::asio::ip::address_v6_*,_std::vector<boost::asio::ip::address_v6,_std::allocator<boost::asio::ip::address_v6>_>_>
           ::operator*(&__end3_1);
      boost::asio::ip::address_v6::to_string_abi_cxx11_
                ((string *)local_708,(address_v6 *)ip_1.field_2._8_8_);
      ::std::__cxx11::string::operator+=((string *)local_48,"&ipv6=");
      aVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
                )::std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_708);
      str_05._M_len = aVar19._8_8_;
      str_05._M_str = pcVar11;
      local_738 = aVar19;
      escape_string_abi_cxx11_(&local_728,(libtorrent *)aVar19._M_allocated_capacity,str_05);
      ::std::__cxx11::string::operator+=((string *)local_48,(string *)&local_728);
      ::std::__cxx11::string::~string((string *)&local_728);
      ::std::__cxx11::string::~string((string *)local_708);
      __gnu_cxx::
      __normal_iterator<const_boost::asio::ip::address_v6_*,_std::vector<boost::asio::ip::address_v6,_std::allocator<boost::asio::ip::address_v6>_>_>
      ::operator++(&__end3_1);
    }
  }
  if ((settings._3_1_ & 1) == 0) {
    ptVar9 = tracker_connection::tracker_req(&this->super_tracker_connection);
    bVar7 = listen_socket_handle::operator_cast_to_bool(&ptVar9->outgoing_socket);
    if (!bVar7) {
      boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                (&local_748,invalid_listen_socket,(type *)0x0);
      local_750 = 0;
      ::std::chrono::duration<int,std::ratio<1l,1l>>::duration<int,void>(local_74c,&local_750);
      local_758._0_4_ = 0;
      ::std::chrono::duration<int,std::ratio<1l,1l>>::duration<int,void>
                ((duration<int,std::ratio<1l,1l>> *)(local_758 + 4),(int *)local_758);
      tracker_connection::fail
                (&this->super_tracker_connection,&local_748,get_interface,
                 "outgoing socket was closed",(seconds32)local_74c,(seconds32)local_758._4_4_);
      settings._4_4_ = 1;
      goto LAB_003b73d4;
    }
  }
  __args_1 = this->m_ioc;
  __args_2 = (_Bind<void_(libtorrent::aux::http_tracker_connection::*(std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>))(const_boost::system::error_code_&,_const_libtorrent::aux::http_parser_&,_libtorrent::span<const_char>)>
              *)tracker_manager::host_resolver((this->super_tracker_connection).m_man);
  local_7a8._16_8_ = on_response;
  local_7a8._24_8_ = (per_timer_data *)0x0;
  shared_from_this((http_tracker_connection *)local_7a8);
  ::std::
  bind<void(libtorrent::aux::http_tracker_connection::*)(boost::system::error_code_const&,libtorrent::aux::http_parser_const&,libtorrent::span<char_const>),std::shared_ptr<libtorrent::aux::http_tracker_connection>,std::_Placeholder<1>const&,std::_Placeholder<2>const&,std::_Placeholder<3>const&>
            ((type *)(local_7a8 + 0x20),
             (offset_in_http_tracker_connection_to_subr *)(local_7a8 + 0x10),
             (shared_ptr<libtorrent::aux::http_tracker_connection> *)local_7a8,
             (_Placeholder<1> *)&::std::placeholders::_1,(_Placeholder<2> *)&::std::placeholders::_2
             ,(_Placeholder<3> *)&::std::placeholders::_3);
  local_7b0[7] = '\x01';
  local_7b0._0_4_ = session_settings::get_int((session_settings *)arguments_start,0x4073);
  local_7f0._16_8_ = on_connect;
  local_7f0._24_8_ =
       (prop_fns<boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
        *)0x0;
  shared_from_this((http_tracker_connection *)local_7f0);
  ::std::
  bind<void(libtorrent::aux::http_tracker_connection::*)(libtorrent::aux::http_connection&),std::shared_ptr<libtorrent::aux::http_tracker_connection>,std::_Placeholder<1>const&>
            ((type *)&local_7d0,(offset_in_http_tracker_connection_to_subr *)(local_7f0 + 0x10),
             (shared_ptr<libtorrent::aux::http_tracker_connection> *)local_7f0,
             (_Placeholder<1> *)&::std::placeholders::_1);
  local_830._16_8_ = on_filter;
  local_830._24_8_ = 0;
  shared_from_this((http_tracker_connection *)local_830);
  ::std::
  bind<void(libtorrent::aux::http_tracker_connection::*)(libtorrent::aux::http_connection&,std::vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>>>&),std::shared_ptr<libtorrent::aux::http_tracker_connection>,std::_Placeholder<1>const&,std::_Placeholder<2>const&>
            ((type *)(local_830 + 0x20),
             (offset_in_http_tracker_connection_to_subr *)(local_830 + 0x10),
             (shared_ptr<libtorrent::aux::http_tracker_connection> *)local_830,
             (_Placeholder<1> *)&::std::placeholders::_1,(_Placeholder<2> *)&::std::placeholders::_2
            );
  local_860 = on_filter_hostname;
  local_858 = (context *)0x0;
  shared_from_this((http_tracker_connection *)local_870);
  ::std::
  bind<bool(libtorrent::aux::http_tracker_connection::*)(libtorrent::aux::http_connection&,std::basic_string_view<char,std::char_traits<char>>),std::shared_ptr<libtorrent::aux::http_tracker_connection>,std::_Placeholder<1>const&,std::_Placeholder<2>const&>
            (&local_850,(offset_in_http_tracker_connection_to_subr *)&local_860,
             (shared_ptr<libtorrent::aux::http_tracker_connection> *)local_870,
             (_Placeholder<1> *)&::std::placeholders::_1,(_Placeholder<2> *)&::std::placeholders::_2
            );
  tracker_connection::tracker_req(&this->super_tracker_connection);
  ::std::
  make_shared<libtorrent::aux::http_connection,boost::asio::io_context&,libtorrent::aux::resolver_interface&,std::_Bind<void(libtorrent::aux::http_tracker_connection::*(std::shared_ptr<libtorrent::aux::http_tracker_connection>,std::_Placeholder<1>,std::_Placeholder<2>,std::_Placeholder<3>))(boost::system::error_code_const&,libtorrent::aux::http_parser_const&,libtorrent::span<char_const>)>,bool,int,std::_Bind<void(libtorrent::aux::http_tracker_connection::*(std::shared_ptr<libtorrent::aux::http_tracker_connection>,std::_Placeholder<1>))(libtorrent::aux::http_connection&)>,std::_Bind<void(libtorrent::aux::http_tracker_connection::*(std::shared_ptr<libtorrent::aux::http_tracker_connection>,std::_Placeholder<1>,std::_Placeholder<2>))(libtorrent::aux::http_connection&,std::vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>>>&)>,std::_Bind<bool(libtorrent::aux::http_tracker_connection::*(std::shared_ptr<libtorrent::aux::http_tracker_connection>,std::_Placeholder<1>,std::_Placeholder<2>))(libtorrent::aux::http_connection&,std::basic_string_view<char,std::char_traits<char>>)>,boost::asio::ssl::context*const&>
            (&local_768,(resolver_interface *)__args_1,__args_2,(bool *)(local_7a8 + 0x20),
             (int *)(local_7b0 + 7),
             (_Bind<void_(libtorrent::aux::http_tracker_connection::*(std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::_Placeholder<1>))(libtorrent::aux::http_connection_&)>
              *)local_7b0,&local_7d0,
             (_Bind<bool_(libtorrent::aux::http_tracker_connection::*(std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::_Placeholder<1>,_std::_Placeholder<2>))(libtorrent::aux::http_connection_&,_std::basic_string_view<char,_std::char_traits<char>_>)>
              *)(local_830 + 0x20),(context **)&local_850);
  ::std::shared_ptr<libtorrent::aux::http_connection>::operator=
            (&this->m_tracker_connection,(shared_ptr<libtorrent::aux::http_connection> *)&local_768)
  ;
  ::std::shared_ptr<libtorrent::aux::http_connection>::~shared_ptr
            ((shared_ptr<libtorrent::aux::http_connection> *)&local_768);
  ::std::
  _Bind<bool_(libtorrent::aux::http_tracker_connection::*(std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::_Placeholder<1>,_std::_Placeholder<2>))(libtorrent::aux::http_connection_&,_std::basic_string_view<char,_std::char_traits<char>_>)>
  ::~_Bind(&local_850);
  ::std::shared_ptr<libtorrent::aux::http_tracker_connection>::~shared_ptr
            ((shared_ptr<libtorrent::aux::http_tracker_connection> *)local_870);
  ::std::
  _Bind<void_(libtorrent::aux::http_tracker_connection::*(std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::_Placeholder<1>,_std::_Placeholder<2>))(libtorrent::aux::http_connection_&,_std::vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>_&)>
  ::~_Bind((_Bind<void_(libtorrent::aux::http_tracker_connection::*(std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::_Placeholder<1>,_std::_Placeholder<2>))(libtorrent::aux::http_connection_&,_std::vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>_&)>
            *)(local_830 + 0x20));
  ::std::shared_ptr<libtorrent::aux::http_tracker_connection>::~shared_ptr
            ((shared_ptr<libtorrent::aux::http_tracker_connection> *)local_830);
  ::std::
  _Bind<void_(libtorrent::aux::http_tracker_connection::*(std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::_Placeholder<1>))(libtorrent::aux::http_connection_&)>
  ::~_Bind((_Bind<void_(libtorrent::aux::http_tracker_connection::*(std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::_Placeholder<1>))(libtorrent::aux::http_connection_&)>
            *)&local_7d0);
  ::std::shared_ptr<libtorrent::aux::http_tracker_connection>::~shared_ptr
            ((shared_ptr<libtorrent::aux::http_tracker_connection> *)local_7f0);
  ::std::
  _Bind<void_(libtorrent::aux::http_tracker_connection::*(std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>))(const_boost::system::error_code_&,_const_libtorrent::aux::http_parser_&,_libtorrent::span<const_char>)>
  ::~_Bind((_Bind<void_(libtorrent::aux::http_tracker_connection::*(std::shared_ptr<libtorrent::aux::http_tracker_connection>,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>))(const_boost::system::error_code_&,_const_libtorrent::aux::http_parser_&,_libtorrent::span<const_char>)>
            *)(local_7a8 + 0x20));
  ::std::shared_ptr<libtorrent::aux::http_tracker_connection>::~shared_ptr
            ((shared_ptr<libtorrent::aux::http_tracker_connection> *)local_7a8);
  ptVar9 = tracker_connection::tracker_req(&this->super_tracker_connection);
  if (ptVar9->event == stopped) {
    local_bc0 = session_settings::get_int((session_settings *)arguments_start,0x4002);
  }
  else {
    local_bc0 = session_settings::get_int((session_settings *)arguments_start,0x4000);
  }
  user_agent.field_2._12_4_ = local_bc0;
  bVar7 = session_settings::get_bool((session_settings *)arguments_start,0x8026);
  local_bc6 = 0;
  if (bVar7) {
    ptVar9 = tracker_connection::tracker_req(&this->super_tracker_connection);
    local_bc6 = ptVar9->private_torrent ^ 0xff;
  }
  user_agent.field_2._M_local_buf[0xb] = local_bc6 & 1;
  ls.m_sock.super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._6_1_ = 0;
  if (user_agent.field_2._M_local_buf[0xb] == 0) {
    psVar15 = session_settings::get_str_abi_cxx11_((session_settings *)arguments_start,0);
    ::std::__cxx11::string::string((string *)local_898,(string *)psVar15);
  }
  else {
    ::std::allocator<char>::allocator();
    ls.m_sock.super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi._6_1_ = 1;
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_898,"curl/7.81.0",
               (allocator<char> *)
               ((long)&ls.m_sock.
                       super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi + 7));
  }
  if ((ls.m_sock.super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi._6_1_ & 1) != 0) {
    ::std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&ls.m_sock.
                       super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi + 7));
  }
  o = tracker_connection::bind_socket(&this->super_tracker_connection);
  this_00 = &bi.ip.ipv6_address_.scope_id_;
  listen_socket_handle::listen_socket_handle((listen_socket_handle *)this_00,o);
  ps._96_8_ = this_00;
  start::anon_class_8_1_3fcf6645::operator()
            ((bind_info_t *)local_8f0,(anon_class_8_1_3fcf6645 *)&ps.type);
  proxy_settings::proxy_settings((proxy_settings *)local_960,(session_settings *)arguments_start);
  this_01 = ::std::
            __shared_ptr_access<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->m_tracker_connection);
  ::std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1l>> *)&local_970,
             (int *)(user_agent.field_2._M_local_buf + 0xc));
  ::std::chrono::duration<long,std::ratio<1l,1000000000l>>::duration<long,std::ratio<1l,1l>,void>
            ((duration<long,std::ratio<1l,1000000000l>> *)&local_968,&local_970);
  if ((ps.password.field_2._M_local_buf[0xe] & 1U) == 0) {
    local_c00 = (proxy_settings *)0x0;
  }
  else {
    local_c00 = (proxy_settings *)local_960;
  }
  ::std::optional<libtorrent::aux::bind_info_t>::optional<libtorrent::aux::bind_info_t_&,_true>
            (&local_9b8,(bind_info_t *)local_8f0);
  ptVar9 = tracker_connection::tracker_req(&this->super_tracker_connection);
  if (ptVar9->event == stopped) {
    local_9ba.m_val = '\x01';
  }
  else {
    libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::aux::resolver_flag_tag,_void>::
    bitfield_flag(&local_9ba);
  }
  local_9bb = 2;
  local_9b9.m_val =
       (uchar)libtorrent::flags::operator|
                        (local_9ba,
                         (bitfield_flag<unsigned_char,_libtorrent::aux::resolver_flag_tag,_void>)0x2
                        );
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_9e0,"",
             (allocator<char> *)
             ((long)&cb.
                     super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi + 7));
  ptVar9 = tracker_connection::tracker_req(&this->super_tracker_connection);
  http_connection::get
            (this_01,(string *)local_48,local_968,local_c00,5,(string *)local_898,&local_9b8,
             local_9b9,&local_9e0,ptVar9->i2pconn);
  ::std::__cxx11::string::~string((string *)&local_9e0);
  ::std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&cb.
                     super___shared_ptr<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi + 7));
  ::std::optional<libtorrent::aux::bind_info_t>::~optional(&local_9b8);
  iVar8 = ::std::__cxx11::string::size();
  tracker_connection::sent_bytes(&this->super_tracker_connection,iVar8 + 100);
  tracker_connection::requester((tracker_connection *)local_9f8);
  bVar7 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_9f8);
  if (bVar7) {
    peVar16 = ::std::
              __shared_ptr_access<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<libtorrent::aux::request_callback,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_9f8);
    uVar17 = ::std::__cxx11::string::c_str();
    (*peVar16->_vptr_request_callback[7])(peVar16,"==> TRACKER_REQUEST [ url: %s ]",uVar17);
  }
  ::std::shared_ptr<libtorrent::aux::request_callback>::~shared_ptr
            ((shared_ptr<libtorrent::aux::request_callback> *)local_9f8);
  proxy_settings::~proxy_settings((proxy_settings *)local_960);
  bind_info_t::~bind_info_t((bind_info_t *)local_8f0);
  listen_socket_handle::~listen_socket_handle
            ((listen_socket_handle *)&bi.ip.ipv6_address_.scope_id_);
  ::std::__cxx11::string::~string((string *)local_898);
  settings._4_4_ = 0;
LAB_003b73d4:
  ::std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void http_tracker_connection::start()
	{
		std::string url = tracker_req().url;

		if (tracker_req().kind & tracker_request::scrape_request)
		{
			// find and replace "announce" with "scrape"
			// in request

			std::size_t pos = url.find("announce");
			if (pos == std::string::npos)
			{
				fail(errors::scrape_not_available, operation_t::bittorrent);
				return;
			}
			url.replace(pos, 8, "scrape");
		}

#if TORRENT_USE_I2P
		bool const i2p = is_i2p_url(url);
#else
		static const bool i2p = false;
#endif

		aux::session_settings const& settings = m_man.settings();

		// if request-string already contains
		// some parameters, append an ampersand instead
		// of a question mark
		auto const arguments_start = url.find('?');
		if (arguments_start != std::string::npos)
		{
			// tracker URLs that come pre-baked with query string arguments will be
			// rejected when SSRF-mitigation is enabled
			bool const ssrf_mitigation = settings.get_bool(settings_pack::ssrf_mitigation);
			if (ssrf_mitigation && has_tracker_query_string(string_view(url).substr(arguments_start + 1)))
			{
				fail(errors::ssrf_mitigation, operation_t::bittorrent);
				return;
			}
			url += "&";
		}
		else
		{
			url += "?";
		}

		url += "info_hash=";
		url += lt::escape_string({tracker_req().info_hash.data(), 20});

		if (!(tracker_req().kind & tracker_request::scrape_request))
		{
			static aux::array<const char*, 4> const event_string{{{"completed", "started", "stopped", "paused"}}};

			char str[1024];
			std::snprintf(str, sizeof(str)
				, "&peer_id=%s"
				"&port=%d"
				"&uploaded=%" PRId64
				"&downloaded=%" PRId64
				"&left=%" PRId64
				"&corrupt=%" PRId64
				"&key=%08X"
				"%s%s" // event
				"&numwant=%d"
				"&compact=1"
				"&no_peer_id=1"
				, lt::escape_string({tracker_req().pid.data(), 20}).c_str()
				// the i2p tracker seems to verify that the port is not 0,
				// even though it ignores it otherwise
				, tracker_req().listen_port
				, tracker_req().uploaded
				, tracker_req().downloaded
				, tracker_req().left
				, tracker_req().corrupt
				, tracker_req().key
				, (tracker_req().event != event_t::none) ? "&event=" : ""
				, (tracker_req().event != event_t::none) ? event_string[static_cast<int>(tracker_req().event) - 1] : ""
				, tracker_req().num_want);
			url += str;
#if !defined TORRENT_DISABLE_ENCRYPTION
			if (settings.get_int(settings_pack::in_enc_policy) != settings_pack::pe_disabled
				&& settings.get_bool(settings_pack::announce_crypto_support))
				url += "&supportcrypto=1";
#endif
			if (settings.get_bool(settings_pack::report_redundant_bytes))
			{
				url += "&redundant=";
				url += to_string(tracker_req().redundant).data();
			}
			if (!tracker_req().trackerid.empty())
			{
				url += "&trackerid=";
				url += lt::escape_string(tracker_req().trackerid);
			}

#if TORRENT_USE_I2P
			if (i2p && tracker_req().i2pconn)
			{
				if (tracker_req().i2pconn->local_endpoint().empty())
				{
					fail(errors::no_i2p_endpoint, operation_t::bittorrent
						, "Waiting for i2p acceptor from SAM bridge", seconds32(5));
					return;
				}
				else
				{
					url += "&ip=" + tracker_req().i2pconn->local_endpoint () + ".i2p";
				}
			}
			else
#endif
			if (!settings.get_bool(settings_pack::anonymous_mode))
			{
				std::string const& announce_ip = settings.get_str(settings_pack::announce_ip);
				if (!announce_ip.empty())
				{
					url += "&ip=" + lt::escape_string(announce_ip);
				}
			}
		}

		if (!tracker_req().ipv4.empty() && !i2p)
		{
			for (auto const& v4 : tracker_req().ipv4)
			{
				std::string const ip = v4.to_string();
				url += "&ipv4=";
				url += lt::escape_string(ip);
			}
		}
		if (!tracker_req().ipv6.empty() && !i2p)
		{
			for (auto const& v6 : tracker_req().ipv6)
			{
				std::string const ip = v6.to_string();
				url += "&ipv6=";
				url += lt::escape_string(ip);
			}
		}

		// i2p trackers don't use our outgoing sockets, they use the SAM
		// connection
		if (!i2p && !tracker_req().outgoing_socket)
		{
			fail(errors::invalid_listen_socket, operation_t::get_interface
				, "outgoing socket was closed");
			return;
		}

		using namespace std::placeholders;
		m_tracker_connection = std::make_shared<aux::http_connection>(m_ioc, m_man.host_resolver()
			, std::bind(&http_tracker_connection::on_response, shared_from_this(), _1, _2, _3)
			, true, settings.get_int(settings_pack::max_http_recv_buffer_size)
			, std::bind(&http_tracker_connection::on_connect, shared_from_this(), _1)
			, std::bind(&http_tracker_connection::on_filter, shared_from_this(), _1, _2)
			, std::bind(&http_tracker_connection::on_filter_hostname, shared_from_this(), _1, _2)
#if TORRENT_USE_SSL
			, tracker_req().ssl_ctx
#endif
			);

		int const timeout = tracker_req().event == event_t::stopped
			? settings.get_int(settings_pack::stop_tracker_timeout)
			: settings.get_int(settings_pack::tracker_completion_timeout);

		// in anonymous mode we omit the user agent to mitigate fingerprinting of
		// the client. Private torrents is an exception because some private
		// trackers may require the user agent
		bool const anon_user = settings.get_bool(settings_pack::anonymous_mode)
			&& !tracker_req().private_torrent;
		std::string const user_agent = anon_user
			? "curl/7.81.0"
			: settings.get_str(settings_pack::user_agent);

		auto const ls = bind_socket();
		bind_info_t bi = [&ls](){
			if (ls.get() == nullptr)
				return bind_info_t{};
			else
				return bind_info_t{ls.device(), ls.get_local_endpoint().address()};
		}();

		// when sending stopped requests, prefer the cached DNS entry
		// to avoid being blocked for slow or failing responses. Chances
		// are that we're shutting down, and this should be a best-effort
		// attempt. It's not worth stalling shutdown.
		aux::proxy_settings ps(settings);
		m_tracker_connection->get(url, seconds(timeout)
			, ps.proxy_tracker_connections ? &ps : nullptr
			, 5, user_agent, bi
			, (tracker_req().event == event_t::stopped
				? aux::resolver_interface::cache_only : aux::resolver_flags{})
				| aux::resolver_interface::abort_on_shutdown
#if TORRENT_ABI_VERSION == 1
			, tracker_req().auth
#else
			, ""
#endif
#if TORRENT_USE_I2P
			, tracker_req().i2pconn
#endif
			);

		// the url + 100 estimated header size
		sent_bytes(int(url.size()) + 100);

#ifndef TORRENT_DISABLE_LOGGING

		std::shared_ptr<request_callback> cb = requester();
		if (cb)
		{
			cb->debug_log("==> TRACKER_REQUEST [ url: %s ]", url.c_str());
		}
#endif
	}